

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O1

void pstore::command_line::details::report_unknown_option<std::ostream>
               (string *program_name,string *arg_name,
               maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *value,basic_ostream<char,_std::char_traits<char>_> *errs)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string local_38;
  
  if (value->valid_ == true) {
    pbVar2 = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator->(value);
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    pcVar1 = (pbVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + pbVar2->_M_string_length);
  }
  else {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  }
  report_unknown_option<std::ostream>(program_name,arg_name,&local_38,errs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void report_unknown_option (std::string const & program_name,
                                        std::string const & arg_name,
                                        maybe<std::string> const & value, ErrorStream & errs) {
                report_unknown_option (program_name, arg_name, value ? *value : "", errs);
            }